

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t gnu_sparse_old_parse(archive_read *a,tar *tar,gnu_sparse *sparse,wchar_t length)

{
  wchar_t wVar1;
  int64_t offset;
  int64_t remaining;
  int iVar2;
  
  if (L'\0' < length) {
    iVar2 = length + L'\x01';
    do {
      if (sparse->offset[0] == '\0') {
        return L'\0';
      }
      offset = tar_atol(sparse->offset,0xc);
      remaining = tar_atol(sparse->numbytes,0xc);
      wVar1 = gnu_add_sparse_entry(a,tar,offset,remaining);
      if (wVar1 != L'\0') {
        return L'\xffffffe2';
      }
      iVar2 = iVar2 + -1;
      sparse = sparse + 1;
    } while (1 < iVar2);
  }
  return L'\0';
}

Assistant:

static int
gnu_sparse_old_parse(struct archive_read *a, struct tar *tar,
    const struct gnu_sparse *sparse, int length)
{
	while (length > 0 && sparse->offset[0] != 0) {
		if (gnu_add_sparse_entry(a, tar,
		    tar_atol(sparse->offset, sizeof(sparse->offset)),
		    tar_atol(sparse->numbytes, sizeof(sparse->numbytes)))
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		sparse++;
		length--;
	}
	return (ARCHIVE_OK);
}